

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::AutoSetupRecyclerForNonCollectingMark::DoCommonSetup
          (AutoSetupRecyclerForNonCollectingMark *this)

{
  code *pcVar1;
  bool bVar2;
  CollectionState CVar3;
  undefined8 *in_FS_OFFSET;
  AutoSetupRecyclerForNonCollectingMark *this_local;
  
  CVar3 = ObservableValue::operator_cast_to_CollectionState
                    ((ObservableValue *)&this->m_recycler->collectionState);
  if ((CVar3 != CollectionStateNotCollecting) &&
     (CVar3 = ObservableValue::operator_cast_to_CollectionState
                        ((ObservableValue *)&this->m_recycler->collectionState),
     CVar3 != CollectionStateExit)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f04,
                       "(m_recycler.collectionState == CollectionStateNotCollecting || m_recycler.collectionState == CollectionStateExit)"
                       ,
                       "m_recycler.collectionState == CollectionStateNotCollecting || m_recycler.collectionState == CollectionStateExit"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  bVar2 = DoQueueTrackedObject(this->m_recycler);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f06,"(!m_recycler.DoQueueTrackedObject())",
                       "!m_recycler.DoQueueTrackedObject()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if ((this->m_recycler->inPartialCollectMode & 1U) != 0) {
    Recycler::FinishPartialCollect(this->m_recycler,(RecyclerSweepManager *)0x0);
  }
  CVar3 = ObservableValue::operator_cast_to_CollectionState
                    ((ObservableValue *)&this->m_recycler->collectionState);
  this->m_previousCollectionState = CVar3;
  memcpy(&this->m_previousCollectionStats,&this->m_recycler->collectionStats,0x538);
  memset(&this->m_recycler->collectionStats,0,0x538);
  this->m_setupDone = true;
  return;
}

Assistant:

void Recycler::AutoSetupRecyclerForNonCollectingMark::DoCommonSetup()
{
    Assert(m_recycler.collectionState == CollectionStateNotCollecting || m_recycler.collectionState == CollectionStateExit);
#if ENABLE_CONCURRENT_GC
    Assert(!m_recycler.DoQueueTrackedObject());
#endif
#if ENABLE_PARTIAL_GC
    // We need to get out of partial collect before we do the mark because we
    // will mess with the free bit vector state
    // GC-CONSIDER: don't mess with the free bit vector?
    if (m_recycler.inPartialCollectMode)
    {
        m_recycler.FinishPartialCollect();
    }
#endif
    m_previousCollectionState = m_recycler.collectionState;
#ifdef RECYCLER_STATS
    m_previousCollectionStats = m_recycler.collectionStats;
    memset(&m_recycler.collectionStats, 0, sizeof(RecyclerCollectionStats));
#endif
    m_setupDone = true;
}